

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_linal_check_measurement_residual
               (double *x,double *S,double z,double *h,double sigma,double k_sigma,size_t n)

{
  double dVar1;
  double local_60;
  double s;
  size_t k;
  size_t j;
  size_t i;
  size_t n_local;
  double k_sigma_local;
  double sigma_local;
  double *h_local;
  double z_local;
  double *S_local;
  double *x_local;
  
  k_sigma_local = sigma * sigma;
  h_local = (double *)z;
  for (j = 0; j < n; j = j + 1) {
    h_local = (double *)(-h[j] * x[j] + (double)h_local);
    k = 0;
    s = (double)j;
    local_60 = 0.0;
    while (k <= j) {
      local_60 = h[k] * S[(long)s] + local_60;
      k = k + 1;
      s = (double)((n - k) + (long)s);
    }
    k_sigma_local = local_60 * local_60 + k_sigma_local;
  }
  dVar1 = sqrt(k_sigma_local);
  return ABS((double)h_local) < k_sigma * dVar1;
}

Assistant:

char fsnav_linal_check_measurement_residual(double* x, double* S, double z, double* h, double sigma, double k_sigma, const size_t n)
{
	size_t i, j, k;

	double s;

	sigma = sigma*sigma;
	for (i = 0; i < n; i++) {
		// dz = z - h*x: residual
		z -= h[i]*x[i];
		// s = h*S*S^T*h^T: predicted variance 
		for (j = 0, k = i, s = 0; j <= i; j++, k += n-j)
			s += h[j]*S[k];
		sigma += s*s;
	}
	sigma = sqrt(sigma);

	return (fabs(z) < k_sigma*sigma) ? 1 : 0;
}